

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::ZConsVisitor::ZConsVisitor(ZConsVisitor *this,SimInfo *info)

{
  bool bVar1;
  SnapshotManager *this_00;
  Snapshot *pSVar2;
  size_t sVar3;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *this_01;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  RealType RVar4;
  __enable_if_t<is_constructible<value_type,_pair<int,_ZConsState>_>::value,_pair<iterator,_bool>_>
  _Var5;
  __enable_if_t<is_constructible<value_type,_pair<int,_int>_>::value,_pair<iterator,_bool>_> _Var6;
  Atom *at;
  AtomIterator ai;
  Molecule *mol;
  iterator j;
  int zmolIndex;
  int i;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  int nZconstraints;
  Globals *simParam;
  ZConsReader *in_stack_000005d0;
  Globals *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  string *in_stack_fffffffffffffdd8;
  string *this_02;
  map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
  *in_stack_fffffffffffffde0;
  Atom *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  SimInfo *info_00;
  ZConsReader *this_03;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  _Base_ptr local_c0;
  undefined1 local_b8;
  int local_b0;
  int local_ac;
  pair<int,_int> local_a8;
  Atom *local_a0;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_98;
  Molecule *local_90;
  _Self local_88;
  _Base_ptr local_80;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_> local_78;
  _Base_ptr local_70;
  undefined1 local_68;
  undefined4 local_5c;
  pair<int,_OpenMD::ZConsVisitor::ZConsState> local_58;
  int local_50;
  int local_4c;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> local_48;
  int local_2c;
  Globals *local_28;
  undefined8 local_10;
  
  local_10 = in_RSI;
  BaseVisitor::BaseVisitor((BaseVisitor *)0x352d2c);
  *in_RDI = &PTR__ZConsVisitor_00486618;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x352d4f);
  std::
  map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
  ::map((map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
         *)0x352d68);
  info_00 = (SimInfo *)(in_RDI + 0x10);
  std::__cxx11::string::string((string *)info_00);
  in_RDI[0x14] = 0;
  in_RDI[0x15] = local_10;
  this_03 = (ZConsReader *)(in_RDI + 0x17);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x352db7)
  ;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"ZConsVisitor");
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[0x15]);
  pSVar2 = SnapshotManager::getCurrentSnapshot(this_00);
  in_RDI[0x16] = pSVar2;
  local_28 = SimInfo::getSimParams((SimInfo *)in_RDI[0x15]);
  bVar1 = Globals::haveZconsTime((Globals *)0x352e50);
  if (bVar1) {
    RVar4 = Globals::getZconsTime((Globals *)0x352e73);
    in_RDI[0xf] = RVar4;
  }
  else {
    snprintf(painCave.errMsg,2000,
             "ZConstraint error: If you use a ZConstraint,\n\tyou must set zconsTime.\n");
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = Globals::haveZconsTol((Globals *)0x352ef9);
  if (bVar1) {
    RVar4 = Globals::getZconsTol((Globals *)0x352f1c);
    in_RDI[0xe] = RVar4;
  }
  else {
    in_RDI[0xe] = 0x3f847ae147ae147b;
    snprintf(painCave.errMsg,2000,
             "ZConstraint Warning: Tolerance for z-constraint method is not specified.\n\tOpenMD will use a default value of %f.\n\tTo set the tolerance, use the zconsTol variable.\n"
             ,in_RDI[0xe]);
    painCave.isFatal = 0;
    simError();
  }
  sVar3 = Globals::getNZconsStamps((Globals *)0x352fa4);
  local_2c = (int)sVar3;
  Globals::getZconsStamps(in_stack_fffffffffffffdc8);
  for (local_4c = 0; local_4c < local_2c; local_4c = local_4c + 1) {
    std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::operator[]
              (&local_48,(long)local_4c);
    local_50 = ZConsStamp::getMolIndex((ZConsStamp *)0x353010);
    local_5c = 1;
    local_58 = std::make_pair<int&,OpenMD::ZConsVisitor::ZConsState>
                         ((int *)in_stack_fffffffffffffdc8,(ZConsState *)0x35305b);
    _Var5 = std::
            map<int,OpenMD::ZConsVisitor::ZConsState,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZConsVisitor::ZConsState>>>
            ::insert<std::pair<int,OpenMD::ZConsVisitor::ZConsState>>
                      (in_stack_fffffffffffffde0,
                       (pair<int,_OpenMD::ZConsVisitor::ZConsState> *)in_stack_fffffffffffffdd8);
    local_70 = (_Base_ptr)_Var5.first._M_node;
    local_68 = _Var5.second;
  }
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::_Rb_tree_iterator
            (&local_78);
  local_80 = (_Base_ptr)
             std::
             map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
             ::begin((map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
                      *)in_stack_fffffffffffffdc8);
  local_78._M_node = local_80;
  while( true ) {
    local_88._M_node =
         (_Base_ptr)
         std::
         map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
         ::end((map<int,_OpenMD::ZConsVisitor::ZConsState,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
                *)in_stack_fffffffffffffdc8);
    bVar1 = std::operator!=(&local_78,&local_88);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_> *)
               0x353170);
    local_90 = SimInfo::getMoleculeByGlobalIndex
                         ((SimInfo *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                          (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_98);
    local_a0 = Molecule::beginAtom((Molecule *)
                                   CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                                   (iterator *)in_stack_fffffffffffffde8);
    while (local_a0 != (Atom *)0x0) {
      local_ac = StuntDouble::getGlobalIndex(&local_a0->super_StuntDouble);
      local_b0 = Molecule::getGlobalIndex(local_90);
      local_a8 = std::make_pair<int,int>((int *)in_stack_fffffffffffffdc8,(int *)0x35323b);
      _Var6 = std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
              insert<std::pair<int,int>>
                        ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)in_stack_fffffffffffffde0,(pair<int,_int> *)in_stack_fffffffffffffdd8);
      local_c0 = (_Base_ptr)_Var6.first._M_node;
      in_stack_fffffffffffffdf7 = _Var6.second;
      local_b8 = in_stack_fffffffffffffdf7;
      in_stack_fffffffffffffde8 =
           Molecule::nextAtom((Molecule *)
                              CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                              (iterator *)in_stack_fffffffffffffde8);
      local_a0 = in_stack_fffffffffffffde8;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_> *)
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  }
  SimInfo::getFinalConfigFileName_abi_cxx11_((SimInfo *)in_stack_fffffffffffffdc8);
  getPrefix(in_stack_fffffffffffffdd8);
  std::operator+(in_stack_fffffffffffffdd8,
                 (char *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  this_02 = local_e0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x10),this_02);
  std::__cxx11::string::~string(this_02);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  this_01 = (vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *)
            operator_new(0x248);
  ZConsReader::ZConsReader(this_03,info_00);
  in_RDI[0x14] = this_01;
  bVar1 = ZConsReader::hasNextFrame((ZConsReader *)0x3533a0);
  if (bVar1) {
    ZConsReader::readNextFrame(in_stack_000005d0);
  }
  std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::~vector(this_01);
  return;
}

Assistant:

ZConsVisitor::ZConsVisitor(SimInfo* info) :
      BaseVisitor(), zconsReader_(NULL), info_(info) {
    visitorName       = "ZConsVisitor";
    currSnapshot_     = info_->getSnapshotManager()->getCurrentSnapshot();
    Globals* simParam = info_->getSimParams();

    if (simParam->haveZconsTime()) {
      zconsTime_ = simParam->getZconsTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZConstraint error: If you use a ZConstraint,\n"
               "\tyou must set zconsTime.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTol()) {
      zconsTol_ = simParam->getZconsTol();
    } else {
      zconsTol_ = 0.01;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZConstraint Warning: Tolerance for z-constraint method is not "
               "specified.\n"
               "\tOpenMD will use a default value of %f.\n"
               "\tTo set the tolerance, use the zconsTol variable.\n",
               zconsTol_);
      painCave.isFatal = 0;
      simError();
    }

    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();
    for (int i = 0; i < nZconstraints; i++) {
      int zmolIndex = stamp[i]->getMolIndex();
      zmolStates_.insert(std::make_pair(zmolIndex, zsMoving));
    }

    // fill zatomToZmol_ array
    /** @todo only works for single version now*/
    std::map<int, ZConsState>::iterator j;
    for (j = zmolStates_.begin(); j != zmolStates_.end(); ++j) {
      Molecule* mol = info_->getMoleculeByGlobalIndex(j->first);
      assert(mol != NULL);
      Molecule::AtomIterator ai;
      Atom* at;
      for (at = mol->beginAtom(ai); at != NULL; at = mol->nextAtom(ai)) {
        zatomToZmol_.insert(
            std::make_pair(at->getGlobalIndex(), mol->getGlobalIndex()));
      }
    }

    zconsFilename_ = getPrefix(info_->getFinalConfigFileName()) + ".fz";

    zconsReader_ = new ZConsReader(info);

    if (zconsReader_->hasNextFrame()) zconsReader_->readNextFrame();
  }